

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

char * al_fgets(ALLEGRO_FILE *f,char *buf,size_t max)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  
  if (max != 0) {
    pcVar3 = buf;
    if (max == 1) {
LAB_001592be:
      *pcVar3 = '\0';
      return buf;
    }
    iVar2 = al_fgetc(f);
    if (iVar2 != -1) {
      lVar4 = max - 2;
      pcVar1 = buf + 1;
      do {
        pcVar3 = pcVar1;
        pcVar3[-1] = (char)iVar2;
        bVar5 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if ((bVar5) || (iVar2 == 10)) goto LAB_001592be;
        iVar2 = al_fgetc(f);
        pcVar1 = pcVar3 + 1;
      } while (iVar2 != -1);
      iVar2 = (*f->vtable->fi_ferror)(f);
      if (iVar2 == 0) goto LAB_001592be;
    }
  }
  return (char *)0x0;
}

Assistant:

char *al_fgets(ALLEGRO_FILE *f, char * const buf, size_t max)
{
   char *p = buf;
   int c;
   ASSERT(f);
   ASSERT(buf);

   /* Handle silly cases. */
   if (max == 0) {
      return NULL;
   }
   if (max == 1) {
      *buf = '\0';
      return buf;
   }

   /* Return NULL if already at end of file. */
   if ((c = al_fgetc(f)) == EOF) {
      return NULL;
   }

   /* Fill buffer until empty, or we reach a newline or EOF or error. */
   do {
      *p++ = c;
      max--;
      if (max == 1 || c == '\n')
         break;
      c = al_fgetc(f);
   } while (c != EOF);

   /* Return NULL on error. */
   if (c == EOF && al_ferror(f)) {
      return NULL;
   }

   /* Add null terminator. */
   ASSERT(max >= 1);
   *p = '\0';

   return buf;
}